

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedColorMasks.cpp
# Opt level: O0

IterateResult __thiscall
glcts::DrawBuffersIndexedColorMasks::iterate(DrawBuffersIndexedColorMasks *this)

{
  allocator<unsigned_char> *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Context *context;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  GLenum GVar7;
  uint uVar8;
  RGBA epsilon_00;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  TestLog *pTVar10;
  float *pfVar11;
  int *piVar12;
  uint *puVar13;
  MessageBuilder *pMVar14;
  uint local_cf4;
  uint local_ce4;
  uint local_cd4;
  uint local_c1c;
  uint local_c0c;
  uint local_bfc;
  uint local_b3c;
  uint local_b2c;
  uint local_b1c;
  GLenum error_code;
  allocator<char> local_a19;
  string local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  LogImage local_9d0;
  MessageBuilder local_940;
  deUint32 local_7c0;
  deUint32 local_7bc;
  PixelBufferAccess local_7b8;
  TextureFormat local_790;
  undefined1 local_788 [8];
  TextureLevel textureLevel_2;
  uint uStack_758;
  RGBA expected_2;
  undefined1 auStack_748 [8];
  UVec4 e_2;
  allocator<char> local_709;
  string local_708;
  allocator<char> local_6e1;
  string local_6e0;
  LogImage local_6c0;
  MessageBuilder local_630;
  deUint32 local_4b0;
  deUint32 local_4ac;
  PixelBufferAccess local_4a8;
  TextureFormat local_480;
  undefined1 local_478 [8];
  TextureLevel textureLevel_1;
  uint uStack_448;
  RGBA expected_1;
  undefined1 auStack_438 [8];
  UVec4 e_1;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  LogImage local_3b0;
  MessageBuilder local_320;
  deUint32 local_1a0;
  deUint32 local_19c;
  PixelBufferAccess local_198;
  TextureFormat local_170;
  undefined1 local_168 [8];
  TextureLevel textureLevel;
  undefined1 local_138 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> rendered;
  uint uStack_118;
  RGBA expected;
  undefined1 auStack_108 [8];
  UVec4 e;
  int i_8;
  bool success;
  RGBA epsilon;
  int numComponents;
  int i_7;
  IVec4 c1_2;
  int i_6;
  UVec4 c1_1;
  int i_5;
  Vec4 c1;
  int local_a0;
  GLboolean local_9c [4];
  int i_4;
  GLboolean mask [4];
  BlendMaskStateMachine state;
  undefined1 local_68 [4];
  int i_3;
  IVec4 c0_2;
  int i_2;
  UVec4 c0_1;
  int i_1;
  Vec4 c0;
  int i;
  GLuint tex;
  GLint maxDrawBuffers;
  GLenum format;
  Functions *gl;
  DrawBuffersIndexedColorMasks *this_local;
  
  gl = (Functions *)this;
  pRVar9 = deqp::Context::getRenderContext
                     ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context);
  iVar6 = (*pRVar9->_vptr_RenderContext[3])();
  _maxDrawBuffers = CONCAT44(extraout_var,iVar6);
  tex = iterate::WriteMasksFormats[iterate::formatId];
  prepareFramebuffer(this);
  i = 0;
  (**(code **)(_maxDrawBuffers + 0x868))(0x8824,&i);
  if (i < 4) {
    tcu::TestContext::setTestResult
              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.super_TestNode
               .m_testCtx,QP_TEST_RESULT_FAIL,"Minimum number of draw buffers too low");
    this_local._4_4_ = STOP;
  }
  else {
    (**(code **)(_maxDrawBuffers + 0x6f8))(1,c0.m_data + 3);
    (**(code **)(_maxDrawBuffers + 0xb8))(0x8c1a,c0.m_data[3]);
    (**(code **)(_maxDrawBuffers + 0x1398))(0x8c1a,1,tex,0x20,0x20,i);
    for (c0.m_data[2] = 0.0; (int)c0.m_data[2] < i; c0.m_data[2] = (float)((int)c0.m_data[2] + 1)) {
      (**(code **)(_maxDrawBuffers + 0x6b8))
                (0x8d40,(int)c0.m_data[2] + 0x8ce0,c0.m_data[3],0,c0.m_data[2]);
    }
    GVar7 = ReadableType(this,tex);
    if (GVar7 == 0x1401) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(c0_1.m_data + 3),0.15,0.3,0.45,0.6);
      for (c0_1.m_data[2] = 0; uVar8 = c0_1.m_data[2], (int)c0_1.m_data[2] < i;
          c0_1.m_data[2] = c0_1.m_data[2] + 1) {
        pcVar4 = *(code **)(_maxDrawBuffers + 0x1a8);
        pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(c0_1.m_data + 3),0);
        (*pcVar4)(0x1800,uVar8,pfVar11);
      }
    }
    else if (GVar7 == 0x1404) {
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_68,2,3,4,5);
      for (state.testLog._4_4_ = 0; state.testLog._4_4_ < i;
          state.testLog._4_4_ = state.testLog._4_4_ + 1) {
        pcVar4 = *(code **)(_maxDrawBuffers + 0x1b0);
        piVar12 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_68,0);
        (*pcVar4)(0x1800,state.testLog._4_4_,piVar12);
      }
    }
    else if (GVar7 == 0x1405) {
      tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)(c0_2.m_data + 3),2,3,4,5);
      for (c0_2.m_data[2] = 0; iVar6 = c0_2.m_data[2], c0_2.m_data[2] < i;
          c0_2.m_data[2] = c0_2.m_data[2] + 1) {
        pcVar4 = *(code **)(_maxDrawBuffers + 0x1b8);
        puVar13 = tcu::Vector<unsigned_int,_4>::operator[]
                            ((Vector<unsigned_int,_4> *)(c0_2.m_data + 3),0);
        (*pcVar4)(0x1800,iVar6,puVar13);
      }
    }
    context = (this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context;
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                         super_TestNode.m_testCtx);
    DrawBuffersIndexedBase::BlendMaskStateMachine::BlendMaskStateMachine
              ((BlendMaskStateMachine *)&i_4,context,pTVar10,i);
    memset(local_9c,0,4);
    for (local_a0 = 0; local_a0 < i; local_a0 = local_a0 + 1) {
      local_9c[local_a0 % 4] = '\x01';
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMaski
                ((BlendMaskStateMachine *)&i_4,local_a0,local_9c[0],local_9c[1],local_9c[2],
                 local_9c[3]);
      local_9c[local_a0 % 4] = '\0';
    }
    GVar7 = ReadableType(this,tex);
    if (GVar7 == 0x1401) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(c1_1.m_data + 3),0.85,0.85,0.85,0.85);
      for (c1_1.m_data[2] = 0; uVar8 = c1_1.m_data[2], (int)c1_1.m_data[2] < i;
          c1_1.m_data[2] = c1_1.m_data[2] + 1) {
        pcVar4 = *(code **)(_maxDrawBuffers + 0x1a8);
        pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(c1_1.m_data + 3),0);
        (*pcVar4)(0x1800,uVar8,pfVar11);
      }
    }
    else if (GVar7 == 0x1404) {
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&numComponents,0x17,0x17,0x17,0x17);
      for (epsilon.m_value = 0; (int)epsilon.m_value < i; epsilon.m_value = epsilon.m_value + 1) {
        pcVar4 = *(code **)(_maxDrawBuffers + 0x1b0);
        piVar12 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&numComponents,0);
        (*pcVar4)(0x1800,epsilon.m_value,piVar12);
      }
    }
    else if (GVar7 == 0x1405) {
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)(c1_2.m_data + 3),0x17,0x17,0x17,0x17);
      for (c1_2.m_data[2] = 0; iVar6 = c1_2.m_data[2], c1_2.m_data[2] < i;
          c1_2.m_data[2] = c1_2.m_data[2] + 1) {
        pcVar4 = *(code **)(_maxDrawBuffers + 0x1b8);
        puVar13 = tcu::Vector<unsigned_int,_4>::operator[]
                            ((Vector<unsigned_int,_4> *)(c1_2.m_data + 3),0);
        (*pcVar4)(0x1800,iVar6,puVar13);
      }
    }
    uVar8 = NumComponents(this,tex);
    epsilon_00 = GetEpsilon(this);
    e.m_data[3]._3_1_ = 1;
    for (e.m_data[2] = 0; (int)e.m_data[2] < i; e.m_data[2] = e.m_data[2] + 1) {
      (**(code **)(_maxDrawBuffers + 0x1218))(e.m_data[2] + 0x8ce0);
      GVar7 = ReadableType(this,tex);
      if (GVar7 == 0x1401) {
        tcu::Vector<unsigned_int,_4>::Vector
                  ((Vector<unsigned_int,_4> *)auStack_108,0x26,0x4c,0x72,0x99);
        puVar13 = tcu::Vector<unsigned_int,_4>::operator[]
                            ((Vector<unsigned_int,_4> *)auStack_108,(int)e.m_data[2] % 4);
        *puVar13 = 0xd8;
        puVar13 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)auStack_108);
        uVar1 = *puVar13;
        if ((int)uVar8 < 2) {
          local_b1c = 0;
        }
        else {
          puVar13 = tcu::Vector<unsigned_int,_4>::y((Vector<unsigned_int,_4> *)auStack_108);
          local_b1c = *puVar13;
        }
        if ((int)uVar8 < 3) {
          local_b2c = 0;
        }
        else {
          puVar13 = tcu::Vector<unsigned_int,_4>::z((Vector<unsigned_int,_4> *)auStack_108);
          local_b2c = *puVar13;
        }
        if (uVar8 == 4) {
          puVar13 = tcu::Vector<unsigned_int,_4>::w((Vector<unsigned_int,_4> *)auStack_108);
          local_b3c = *puVar13;
        }
        else {
          local_b3c = 0xff;
        }
        tcu::Vector<unsigned_int,_4>::Vector
                  ((Vector<unsigned_int,_4> *)&stack0xfffffffffffffee8,uVar1,local_b1c,local_b2c,
                   local_b3c);
        auStack_108._0_4_ = uStack_118;
        auStack_108._4_4_ = expected.m_value;
        puVar13 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)auStack_108);
        uVar1 = *puVar13;
        puVar13 = tcu::Vector<unsigned_int,_4>::y((Vector<unsigned_int,_4> *)auStack_108);
        uVar2 = *puVar13;
        puVar13 = tcu::Vector<unsigned_int,_4>::z((Vector<unsigned_int,_4> *)auStack_108);
        uVar3 = *puVar13;
        puVar13 = tcu::Vector<unsigned_int,_4>::w((Vector<unsigned_int,_4> *)auStack_108);
        tcu::RGBA::RGBA((RGBA *)((long)&rendered.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                        uVar1,uVar2,uVar3,*puVar13);
        textureLevel.m_data.m_cap._7_1_ = 0x2d;
        this_00 = (allocator<unsigned_char> *)((long)&textureLevel.m_data.m_cap + 6);
        std::allocator<unsigned_char>::allocator(this_00);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138,0x1000,
                   (value_type_conflict5 *)((long)&textureLevel.m_data.m_cap + 7),this_00);
        std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)((long)&textureLevel.m_data.m_cap + 6));
        tcu::TextureFormat::TextureFormat(&local_170,RGBA,UNORM_INT8);
        tcu::TextureLevel::TextureLevel((TextureLevel *)local_168,&local_170,0x20,0x20,1);
        pRVar9 = deqp::Context::getRenderContext
                           ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context);
        tcu::TextureLevel::getAccess(&local_198,(TextureLevel *)local_168);
        glu::readPixels(pRVar9,0,0,&local_198);
        local_19c = rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        local_1a0 = epsilon_00.m_value;
        bVar5 = VerifyImg(this,(TextureLevel *)local_168,
                          rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,epsilon_00);
        if (!bVar5) {
          pTVar10 = tcu::TestContext::getLog
                              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.
                               super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_320,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar14 = tcu::MessageBuilder::operator<<
                              (&local_320,(char (*) [36])"Write mask error in texture format ");
          pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&tex);
          pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [23])" occurred for buffer #")
          ;
          pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(int *)(e.m_data + 2));
          pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0x2b8f97b);
          tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_320);
          pTVar10 = tcu::TestContext::getLog
                              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.
                               super_TestCase.super_TestNode.m_testCtx);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d0,"Result",&local_3d1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3f8,"Rendered result image",&local_3f9);
          tcu::TextureLevel::getAccess
                    ((PixelBufferAccess *)(e_1.m_data + 2),(TextureLevel *)local_168);
          tcu::LogImage::LogImage
                    (&local_3b0,&local_3d0,&local_3f8,(ConstPixelBufferAccess *)(e_1.m_data + 2),
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::TestLog::operator<<(pTVar10,&local_3b0);
          tcu::LogImage::~LogImage(&local_3b0);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::allocator<char>::~allocator(&local_3f9);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::allocator<char>::~allocator(&local_3d1);
          e.m_data[3]._3_1_ = 0;
        }
        tcu::TextureLevel::~TextureLevel((TextureLevel *)local_168);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
      }
      else if (GVar7 == 0x1404) {
        tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)auStack_748,2,3,4,5);
        puVar13 = tcu::Vector<unsigned_int,_4>::operator[]
                            ((Vector<unsigned_int,_4> *)auStack_748,(int)e.m_data[2] % 4);
        *puVar13 = 0x17;
        puVar13 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)auStack_748);
        uVar1 = *puVar13;
        if ((int)uVar8 < 2) {
          local_cd4 = 0;
        }
        else {
          puVar13 = tcu::Vector<unsigned_int,_4>::y((Vector<unsigned_int,_4> *)auStack_748);
          local_cd4 = *puVar13;
        }
        if ((int)uVar8 < 3) {
          local_ce4 = 0;
        }
        else {
          puVar13 = tcu::Vector<unsigned_int,_4>::z((Vector<unsigned_int,_4> *)auStack_748);
          local_ce4 = *puVar13;
        }
        if (uVar8 == 4) {
          puVar13 = tcu::Vector<unsigned_int,_4>::w((Vector<unsigned_int,_4> *)auStack_748);
          local_cf4 = *puVar13;
        }
        else {
          local_cf4 = 1;
        }
        tcu::Vector<unsigned_int,_4>::Vector
                  ((Vector<unsigned_int,_4> *)&stack0xfffffffffffff8a8,uVar1,local_cd4,local_ce4,
                   local_cf4);
        auStack_748._0_4_ = uStack_758;
        auStack_748._4_4_ = expected_2.m_value;
        puVar13 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)auStack_748);
        uVar1 = *puVar13;
        puVar13 = tcu::Vector<unsigned_int,_4>::y((Vector<unsigned_int,_4> *)auStack_748);
        uVar2 = *puVar13;
        puVar13 = tcu::Vector<unsigned_int,_4>::z((Vector<unsigned_int,_4> *)auStack_748);
        uVar3 = *puVar13;
        puVar13 = tcu::Vector<unsigned_int,_4>::w((Vector<unsigned_int,_4> *)auStack_748);
        tcu::RGBA::RGBA((RGBA *)((long)&textureLevel_2.m_data.m_cap + 4),uVar1,uVar2,uVar3,*puVar13)
        ;
        tcu::TextureFormat::TextureFormat(&local_790,RGBA,SIGNED_INT32);
        tcu::TextureLevel::TextureLevel((TextureLevel *)local_788,&local_790,0x20,0x20,1);
        pRVar9 = deqp::Context::getRenderContext
                           ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context);
        tcu::TextureLevel::getAccess(&local_7b8,(TextureLevel *)local_788);
        glu::readPixels(pRVar9,0,0,&local_7b8);
        local_7bc = textureLevel_2.m_data.m_cap._4_4_;
        local_7c0 = epsilon_00.m_value;
        bVar5 = VerifyImg(this,(TextureLevel *)local_788,textureLevel_2.m_data.m_cap._4_4_,
                          epsilon_00);
        if (!bVar5) {
          pTVar10 = tcu::TestContext::getLog
                              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.
                               super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_940,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar14 = tcu::MessageBuilder::operator<<
                              (&local_940,(char (*) [36])"Write mask error in texture format ");
          pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&tex);
          pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [23])" occurred for buffer #")
          ;
          pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(int *)(e.m_data + 2));
          pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0x2b8f97b);
          tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_940);
          pTVar10 = tcu::TestContext::getLog
                              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.
                               super_TestCase.super_TestNode.m_testCtx);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9f0,"Result",&local_9f1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a18,"Rendered result image",&local_a19);
          tcu::TextureLevel::getAccess
                    ((PixelBufferAccess *)&stack0xfffffffffffff5b8,(TextureLevel *)local_788);
          tcu::LogImage::LogImage
                    (&local_9d0,&local_9f0,&local_a18,
                     (ConstPixelBufferAccess *)&stack0xfffffffffffff5b8,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::TestLog::operator<<(pTVar10,&local_9d0);
          tcu::LogImage::~LogImage(&local_9d0);
          std::__cxx11::string::~string((string *)&local_a18);
          std::allocator<char>::~allocator(&local_a19);
          std::__cxx11::string::~string((string *)&local_9f0);
          std::allocator<char>::~allocator(&local_9f1);
          e.m_data[3]._3_1_ = 0;
        }
        tcu::TextureLevel::~TextureLevel((TextureLevel *)local_788);
      }
      else if (GVar7 == 0x1405) {
        tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)auStack_438,2,3,4,5);
        puVar13 = tcu::Vector<unsigned_int,_4>::operator[]
                            ((Vector<unsigned_int,_4> *)auStack_438,(int)e.m_data[2] % 4);
        *puVar13 = 0x17;
        puVar13 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)auStack_438);
        uVar1 = *puVar13;
        if ((int)uVar8 < 2) {
          local_bfc = 0;
        }
        else {
          puVar13 = tcu::Vector<unsigned_int,_4>::y((Vector<unsigned_int,_4> *)auStack_438);
          local_bfc = *puVar13;
        }
        if ((int)uVar8 < 3) {
          local_c0c = 0;
        }
        else {
          puVar13 = tcu::Vector<unsigned_int,_4>::z((Vector<unsigned_int,_4> *)auStack_438);
          local_c0c = *puVar13;
        }
        if (uVar8 == 4) {
          puVar13 = tcu::Vector<unsigned_int,_4>::w((Vector<unsigned_int,_4> *)auStack_438);
          local_c1c = *puVar13;
        }
        else {
          local_c1c = 1;
        }
        tcu::Vector<unsigned_int,_4>::Vector
                  ((Vector<unsigned_int,_4> *)&stack0xfffffffffffffbb8,uVar1,local_bfc,local_c0c,
                   local_c1c);
        auStack_438._0_4_ = uStack_448;
        auStack_438._4_4_ = expected_1.m_value;
        puVar13 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)auStack_438);
        uVar1 = *puVar13;
        puVar13 = tcu::Vector<unsigned_int,_4>::y((Vector<unsigned_int,_4> *)auStack_438);
        uVar2 = *puVar13;
        puVar13 = tcu::Vector<unsigned_int,_4>::z((Vector<unsigned_int,_4> *)auStack_438);
        uVar3 = *puVar13;
        puVar13 = tcu::Vector<unsigned_int,_4>::w((Vector<unsigned_int,_4> *)auStack_438);
        tcu::RGBA::RGBA((RGBA *)((long)&textureLevel_1.m_data.m_cap + 4),uVar1,uVar2,uVar3,*puVar13)
        ;
        tcu::TextureFormat::TextureFormat(&local_480,RGBA,UNSIGNED_INT32);
        tcu::TextureLevel::TextureLevel((TextureLevel *)local_478,&local_480,0x20,0x20,1);
        pRVar9 = deqp::Context::getRenderContext
                           ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context);
        tcu::TextureLevel::getAccess(&local_4a8,(TextureLevel *)local_478);
        glu::readPixels(pRVar9,0,0,&local_4a8);
        local_4ac = textureLevel_1.m_data.m_cap._4_4_;
        local_4b0 = epsilon_00.m_value;
        bVar5 = VerifyImg(this,(TextureLevel *)local_478,textureLevel_1.m_data.m_cap._4_4_,
                          epsilon_00);
        if (!bVar5) {
          pTVar10 = tcu::TestContext::getLog
                              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.
                               super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_630,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar14 = tcu::MessageBuilder::operator<<
                              (&local_630,(char (*) [36])"Write mask error in texture format ");
          pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&tex);
          pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [23])" occurred for buffer #")
          ;
          pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(int *)(e.m_data + 2));
          pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0x2b8f97b);
          tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_630);
          pTVar10 = tcu::TestContext::getLog
                              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.
                               super_TestCase.super_TestNode.m_testCtx);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6e0,"Result",&local_6e1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_708,"Rendered result image",&local_709);
          tcu::TextureLevel::getAccess
                    ((PixelBufferAccess *)(e_2.m_data + 2),(TextureLevel *)local_478);
          tcu::LogImage::LogImage
                    (&local_6c0,&local_6e0,&local_708,(ConstPixelBufferAccess *)(e_2.m_data + 2),
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::TestLog::operator<<(pTVar10,&local_6c0);
          tcu::LogImage::~LogImage(&local_6c0);
          std::__cxx11::string::~string((string *)&local_708);
          std::allocator<char>::~allocator(&local_709);
          std::__cxx11::string::~string((string *)&local_6e0);
          std::allocator<char>::~allocator(&local_6e1);
          e.m_data[3]._3_1_ = 0;
        }
        tcu::TextureLevel::~TextureLevel((TextureLevel *)local_478);
      }
    }
    (**(code **)(_maxDrawBuffers + 0x238))(1,1,1);
    (**(code **)(_maxDrawBuffers + 0xb8))(0x8c1a,0);
    (**(code **)(_maxDrawBuffers + 0x480))(1);
    releaseFramebuffer(this);
    iVar6 = (**(code **)(_maxDrawBuffers + 0x800))();
    if (iVar6 == 0) {
      if ((e.m_data[3]._3_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                   super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Write mask error occurred");
        iterate::formatId = 0;
        this_local._4_4_ = STOP;
      }
      else {
        iterate::formatId = iterate::formatId + 1;
        if (iterate::formatId < 0x19) {
          this_local._4_4_ = CONTINUE;
        }
        else {
          tcu::TestContext::setTestResult
                    ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                     super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
          iterate::formatId = 0;
          this_local._4_4_ = STOP;
        }
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Some functions generated error");
      iterate::formatId = 0;
      this_local._4_4_ = STOP;
    }
    DrawBuffersIndexedBase::BlendMaskStateMachine::~BlendMaskStateMachine
              ((BlendMaskStateMachine *)&i_4);
  }
  return this_local._4_4_;
}

Assistant:

tcu::TestNode::IterateResult DrawBuffersIndexedColorMasks::iterate()
{
	static const glw::GLenum WriteMasksFormats[] = { GL_R8,		 GL_RG8,	 GL_RGB8,	 GL_RGB565,  GL_RGBA4,
													 GL_RGB5_A1, GL_RGBA8,   GL_R8I,	  GL_R8UI,	GL_R16I,
													 GL_R16UI,   GL_R32I,	GL_R32UI,	GL_RG8I,	GL_RG8UI,
													 GL_RG16I,   GL_RG16UI,  GL_RG32I,	GL_RG32UI,  GL_RGBA8I,
													 GL_RGBA8UI, GL_RGBA16I, GL_RGBA16UI, GL_RGBA32I, GL_RGBA32UI };
	static const int	kSize	= 32;
	static unsigned int formatId = 0;

	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	glw::GLenum			  format = WriteMasksFormats[formatId];

	prepareFramebuffer();

	// Check number of available draw buffers
	glw::GLint maxDrawBuffers = 0;
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	if (maxDrawBuffers < 4)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Minimum number of draw buffers too low");
		return STOP;
	}

	// Prepare render targets
	glw::GLuint tex;
	gl.genTextures(1, &tex);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, tex);
	gl.texStorage3D(GL_TEXTURE_2D_ARRAY, 1, format, kSize, kSize, maxDrawBuffers);
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		gl.framebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, tex, 0, i);
	}

	// Clear all buffers
	switch (ReadableType(format))
	{
	case GL_UNSIGNED_BYTE:
	{
		tcu::Vec4 c0(0.15f, 0.3f, 0.45f, 0.6f);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferfv(GL_COLOR, i, &c0[0]);
		}
		break;
	}
	case GL_UNSIGNED_INT:
	{
		tcu::UVec4 c0(2, 3, 4, 5);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferuiv(GL_COLOR, i, &c0[0]);
		}
		break;
	}
	case GL_INT:
	{
		tcu::IVec4 c0(2, 3, 4, 5);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferiv(GL_COLOR, i, &c0[0]);
		}
		break;
	}
	}

	// Set color masks for each buffer
	BlendMaskStateMachine state(m_context, m_testCtx.getLog(), maxDrawBuffers);

	glw::GLboolean mask[] = { GL_FALSE, GL_FALSE, GL_FALSE, GL_FALSE };
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		mask[i % 4] = GL_TRUE;
		state.SetColorMaski(i, mask[0], mask[1], mask[2], mask[3]);
		mask[i % 4] = GL_FALSE;
	}

	// Clear all buffers
	switch (ReadableType(format))
	{
	case GL_UNSIGNED_BYTE:
	{
		tcu::Vec4 c1(0.85f, 0.85f, 0.85f, 0.85f);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferfv(GL_COLOR, i, &c1[0]);
		}
		break;
	}
	case GL_UNSIGNED_INT:
	{
		tcu::UVec4 c1(23, 23, 23, 23);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferuiv(GL_COLOR, i, &c1[0]);
		}
		break;
	}
	case GL_INT:
	{
		tcu::IVec4 c1(23, 23, 23, 23);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferiv(GL_COLOR, i, &c1[0]);
		}
		break;
	}
	}

	// Verify color
	int		  numComponents = NumComponents(format);
	tcu::RGBA epsilon		= GetEpsilon();
	bool	  success		= true;

	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		gl.readBuffer(GL_COLOR_ATTACHMENT0 + i);

		switch (ReadableType(format))
		{
		case GL_UNSIGNED_BYTE:
		{
			tcu::UVec4 e(static_cast<unsigned int>(0.15f * 255), static_cast<unsigned int>(0.30f * 255),
						 static_cast<unsigned int>(0.45f * 255), static_cast<unsigned int>(0.60f * 255));
			e[i % 4] = static_cast<unsigned int>(0.85f * 255);
			e		 = tcu::UVec4(e.x(), numComponents >= 2 ? e.y() : 0, numComponents >= 3 ? e.z() : 0,
						   numComponents == 4 ? e.w() : 255);
			tcu::RGBA expected(e.x(), e.y(), e.z(), e.w());

			std::vector<unsigned char> rendered(kSize * kSize * 4, 45);

			tcu::TextureLevel textureLevel(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8),
										   kSize, kSize);
			glu::readPixels(m_context.getRenderContext(), 0, 0, textureLevel.getAccess());

			if (!VerifyImg(textureLevel, expected, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Write mask error in texture format " << format
								   << " occurred for buffer #" << i << "\n"
								   << tcu::TestLog::EndMessage;
				m_testCtx.getLog() << tcu::TestLog::Image("Result", "Rendered result image", textureLevel.getAccess());
				success = false;
			}
			break;
		}
		case GL_UNSIGNED_INT:
		{
			tcu::UVec4 e(2, 3, 4, 5);
			e[i % 4] = 23;
			e		 = tcu::UVec4(e.x(), numComponents >= 2 ? e.y() : 0, numComponents >= 3 ? e.z() : 0,
						   numComponents == 4 ? e.w() : 1);
			tcu::RGBA expected(e.x(), e.y(), e.z(), e.w());

			tcu::TextureLevel textureLevel(
				tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT32), kSize, kSize);
			glu::readPixels(m_context.getRenderContext(), 0, 0, textureLevel.getAccess());

			if (!VerifyImg(textureLevel, expected, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Write mask error in texture format " << format
								   << " occurred for buffer #" << i << "\n"
								   << tcu::TestLog::EndMessage;
				m_testCtx.getLog() << tcu::TestLog::Image("Result", "Rendered result image", textureLevel.getAccess());
				success = false;
			}
			break;
		}
		case GL_INT:
		{
			tcu::UVec4 e(2, 3, 4, 5);
			e[i % 4] = 23;
			e		 = tcu::UVec4(e.x(), numComponents >= 2 ? e.y() : 0, numComponents >= 3 ? e.z() : 0,
						   numComponents == 4 ? e.w() : 1);
			tcu::RGBA expected(e.x(), e.y(), e.z(), e.w());

			tcu::TextureLevel textureLevel(
				tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::SIGNED_INT32), kSize, kSize);
			glu::readPixels(m_context.getRenderContext(), 0, 0, textureLevel.getAccess());

			if (!VerifyImg(textureLevel, expected, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Write mask error in texture format " << format
								   << " occurred for buffer #" << i << "\n"
								   << tcu::TestLog::EndMessage;
				m_testCtx.getLog() << tcu::TestLog::Image("Result", "Rendered result image", textureLevel.getAccess());
				success = false;
			}
			break;
		}
		}
	}

	gl.colorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, 0);
	gl.deleteTextures(1, &tex);
	releaseFramebuffer();

	// Check for error
	glw::GLenum error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Some functions generated error");
		formatId = 0;
		return STOP;
	}

	if (!success)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Write mask error occurred");
		formatId = 0;
		return STOP;
	}
	else
	{
		++formatId;
		if (formatId < (sizeof(WriteMasksFormats) / sizeof(WriteMasksFormats[0])))
		{
			return CONTINUE;
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
			formatId = 0;
			return STOP;
		}
	}
}